

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConvertToLHProcess.cpp
# Opt level: O2

void __thiscall Assimp::FlipUVsProcess::Execute(FlipUVsProcess *this,aiScene *pScene)

{
  Logger *pLVar1;
  uint i;
  ulong uVar2;
  
  pLVar1 = DefaultLogger::get();
  Logger::debug(pLVar1,"FlipUVsProcess begin");
  for (uVar2 = 0; uVar2 < pScene->mNumMeshes; uVar2 = uVar2 + 1) {
    ProcessMesh((FlipUVsProcess *)pLVar1,pScene->mMeshes[uVar2]);
  }
  for (uVar2 = 0; uVar2 < pScene->mNumMaterials; uVar2 = uVar2 + 1) {
    ProcessMaterial((FlipUVsProcess *)pLVar1,pScene->mMaterials[uVar2]);
  }
  pLVar1 = DefaultLogger::get();
  Logger::debug(pLVar1,"FlipUVsProcess finished");
  return;
}

Assistant:

void FlipUVsProcess::Execute( aiScene* pScene)
{
    ASSIMP_LOG_DEBUG("FlipUVsProcess begin");
    for (unsigned int i = 0; i < pScene->mNumMeshes;++i)
        ProcessMesh(pScene->mMeshes[i]);

    for (unsigned int i = 0; i < pScene->mNumMaterials;++i)
        ProcessMaterial(pScene->mMaterials[i]);
    ASSIMP_LOG_DEBUG("FlipUVsProcess finished");
}